

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict get_adjacent_member(node_t_conflict member,int next_p)

{
  node_t_conflict pnVar1;
  
  if (member->code != N_MEMBER) {
    __assert_fail("member->code == N_MEMBER",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x1ca0,"node_t get_adjacent_member(node_t, int)");
  }
  while( true ) {
    do {
      member = (&(member->op_link).prev)[next_p != 0];
      if (member == (node_t_conflict)0x0) {
        return (node_t_conflict)0x0;
      }
    } while (member->code != N_MEMBER);
    pnVar1 = DLIST_node_t_el(&(member->u).ops,1);
    if (pnVar1->code != N_IGNORE) break;
    if ((member->attr != (void *)0x0) &&
       (*(char *)(*(long *)((long)member->attr + 0x40) + 0x1d) != '\0')) {
      return member;
    }
  }
  return member;
}

Assistant:

static node_t get_adjacent_member (node_t member, int next_p) {
  assert (member->code == N_MEMBER);
  while ((member = next_p ? NL_NEXT (member) : NL_PREV (member)) != NULL)
    if (member->code == N_MEMBER
        && (NL_EL (member->u.ops, 1)->code != N_IGNORE || anon_struct_union_type_member_p (member)))
      break;
  return member;
}